

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::doCheck(QPDFJob *this,QPDF *pdf)

{
  _func_int **pp_Var1;
  bool bVar2;
  int iVar3;
  Pipeline *pPVar4;
  element_type *__n;
  void *__buf;
  Pl_Discard discard;
  QPDFWriter w;
  QPDFPageDocumentHelper local_70;
  DiscardContents discard_contents;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_48;
  
  QPDFLogger::getInfo((QPDFLogger *)&discard,
                      SUB81((((this->m).
                              super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->log).
                            super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
  pp_Var1 = discard.super_Pipeline._vptr_Pipeline;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&discard.super_Pipeline.identifier);
  pPVar4 = Pipeline::operator<<((Pipeline *)pp_Var1,"checking ");
  __n = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pPVar4 = Pipeline::operator<<
                     (pPVar4,(__n->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
  Pipeline::operator<<(pPVar4,"\n");
  ((pdf->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
   super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->check_mode = true;
  iVar3 = QPDF::getExtensionLevel(pdf);
  pPVar4 = Pipeline::operator<<((Pipeline *)pp_Var1,"PDF Version: ");
  QPDF::getPDFVersion_abi_cxx11_((string *)&discard,pdf);
  Pipeline::operator<<(pPVar4,(string *)&discard);
  std::__cxx11::string::~string((string *)&discard);
  if (0 < iVar3) {
    pPVar4 = Pipeline::operator<<((Pipeline *)pp_Var1," extension level ");
    iVar3 = QPDF::getExtensionLevel(pdf);
    Pipeline::operator<<(pPVar4,iVar3);
  }
  Pipeline::operator<<((Pipeline *)pp_Var1,"\n");
  showEncryption(this,pdf);
  bVar2 = QPDF::isLinearized(pdf);
  if (bVar2) {
    Pipeline::operator<<((Pipeline *)pp_Var1,"File is linearized\n");
    QPDF::checkLinearization(pdf);
  }
  else {
    Pipeline::operator<<((Pipeline *)pp_Var1,"File is not linearized\n");
  }
  QPDFWriter::QPDFWriter(&w,pdf);
  Pl_Discard::Pl_Discard(&discard);
  QPDFWriter::setOutputPipeline(&w,&discard.super_Pipeline);
  iVar3 = 3;
  QPDFWriter::setDecodeLevel(&w,qpdf_dl_all);
  QPDFWriter::write(&w,iVar3,__buf,(size_t)__n);
  discard_contents.super_ParserCallbacks._vptr_ParserCallbacks =
       (ParserCallbacks)&PTR__ParserCallbacks_002b5818;
  QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_70,pdf);
  QPDFPageDocumentHelper::getAllPages(&local_48,&local_70);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_70);
  for (; local_48.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         local_48.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
         _M_impl.super__Vector_impl_data._M_finish;
      local_48.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_48.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
           _M_impl.super__Vector_impl_data._M_start + 1) {
    QPDFPageObjectHelper::parseContents
              (local_48.
               super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
               _M_impl.super__Vector_impl_data._M_start,&discard_contents.super_ParserCallbacks);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_48);
  Pl_Discard::~Pl_Discard(&discard);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&w.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDF::getWarnings((vector<QPDFExc,_std::allocator<QPDFExc>_> *)&discard,pdf);
  pp_Var1 = discard.super_Pipeline._vptr_Pipeline;
  std::vector<QPDFExc,_std::allocator<QPDFExc>_>::~vector
            ((vector<QPDFExc,_std::allocator<QPDFExc>_> *)&discard);
  if (pp_Var1 == (_func_int **)discard.super_Pipeline.identifier._M_dataplus._M_p) {
    QPDFLogger::getInfo((QPDFLogger *)&discard,
                        SUB81((((this->m).
                                super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->log).
                              super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
    pPVar4 = Pipeline::operator<<
                       ((Pipeline *)discard.super_Pipeline._vptr_Pipeline,
                        "No syntax or stream encoding errors found; the file may still contain\n");
    Pipeline::operator<<(pPVar4,"errors that qpdf cannot detect\n");
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&discard.super_Pipeline.identifier);
  }
  else {
    ((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->warnings =
         true;
  }
  return;
}

Assistant:

void
QPDFJob::doCheck(QPDF& pdf)
{
    // Code below may set okay to false but not to true. We assume okay until we prove otherwise but
    // may continue to perform additional checks after finding errors.
    bool okay = true;
    auto& cout = *m->log->getInfo();
    cout << "checking " << m->infilename.get() << "\n";
    QPDF::JobSetter::setCheckMode(pdf, true);
    try {
        int extension_level = pdf.getExtensionLevel();
        cout << "PDF Version: " << pdf.getPDFVersion();
        if (extension_level > 0) {
            cout << " extension level " << pdf.getExtensionLevel();
        }
        cout << "\n";
        showEncryption(pdf);
        if (pdf.isLinearized()) {
            cout << "File is linearized\n";
            pdf.checkLinearization();
        } else {
            cout << "File is not linearized\n";
        }

        // Write the file to nowhere, uncompressing streams.  This causes full file traversal and
        // decoding of all streams we can decode.
        QPDFWriter w(pdf);
        Pl_Discard discard;
        w.setOutputPipeline(&discard);
        w.setDecodeLevel(qpdf_dl_all);
        w.write();

        // Parse all content streams
        DiscardContents discard_contents;
        int pageno = 0;
        for (auto& page: QPDFPageDocumentHelper(pdf).getAllPages()) {
            ++pageno;
            try {
                page.parseContents(&discard_contents);
            } catch (QPDFExc& e) {
                okay = false;
                *m->log->getError() << "ERROR: page " << pageno << ": " << e.what() << "\n";
            }
        }
    } catch (std::exception& e) {
        *m->log->getError() << "ERROR: " << e.what() << "\n";
        okay = false;
    }
    if (!okay) {
        throw std::runtime_error("errors detected");
    }

    if (!pdf.getWarnings().empty()) {
        m->warnings = true;
    } else {
        *m->log->getInfo()
            << "No syntax or stream encoding errors found; the file may still contain\n"
            << "errors that qpdf cannot detect\n";
    }
}